

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O0

void henson::
     Serialization<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     ::save(BinaryBuffer *bb,String *s)

{
  BinaryBuffer *in_RDI;
  size_t sz;
  unsigned_long *in_stack_ffffffffffffffd8;
  BinaryBuffer *in_stack_ffffffffffffffe0;
  
  std::__cxx11::string::size();
  save<unsigned_long>(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::__cxx11::string::c_str();
  save<char>(in_RDI,(char *)in_stack_ffffffffffffffd8,0x324052);
  return;
}

Assistant:

static void         save(BinaryBuffer& bb, const String& s)
    {
      size_t sz = s.size();
      henson::save(bb, sz);
      henson::save(bb, s.c_str(), sz);
    }